

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup
          (ShaderPerformanceCaseGroup *this,TestContext *testCtx,char *name,char *description)

{
  InitialCalibration *this_00;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  ShaderPerformanceCaseGroup *this_local;
  
  tcu::TestCaseGroup::TestCaseGroup(&this->super_TestCaseGroup,testCtx,name,description);
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPerformanceCaseGroup_032e5be8;
  this_00 = (InitialCalibration *)operator_new(4);
  ShaderPerformanceCase::InitialCalibration::InitialCalibration(this_00);
  de::SharedPtr<deqp::gls::ShaderPerformanceCase::InitialCalibration>::SharedPtr
            (&this->m_initialCalibrationStorage,this_00);
  return;
}

Assistant:

ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup (tcu::TestContext& testCtx, const char* name, const char* description)
	: TestCaseGroup					(testCtx, name, description)
	, m_initialCalibrationStorage	(new ShaderPerformanceCase::InitialCalibration)
{
}